

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

void project_feature_handler_DRAGONFIRE(project_feature_handler_context_t *context)

{
  wchar_t wVar1;
  _Bool _Var2;
  uint32_t uVar3;
  
  _Var2 = square_isview(cave,context->grid);
  if ((_Var2) && (player->timed[2] == 0)) {
    context->obvious = true;
  }
  _Var2 = square_iswebbed(cave,context->grid);
  if (_Var2) {
    square_destroy_trap(cave,context->grid);
  }
  wVar1 = context->dam;
  uVar3 = Rand_div(0x708);
  if (uVar3 + L'ə' < wVar1) {
    _Var2 = square_isfloor(cave,context->grid);
    if (_Var2) {
      square_unmark(cave,context->grid);
      square_set_feat(cave,context->grid,FEAT_LAVA);
      push_object(context->grid);
      return;
    }
  }
  return;
}

Assistant:

static void project_feature_handler_DRAGONFIRE(project_feature_handler_context_t *context)
{
	/* Grid is in line of sight and player is not blind */
	if (square_isview(cave, context->grid) && !player->timed[TMD_BLIND]) {
		/* Observe */
		context->obvious = true;
	}

	/* Removes webs */
	if (square_iswebbed(cave, context->grid)) {
		square_destroy_trap(cave, context->grid);
	}

	/* Can create lava if extremely powerful. */
	if ((context->dam > randint1(1800) + 600) &&
		square_isfloor(cave, context->grid)) {
		/* Forget the floor, make lava. */
		square_unmark(cave, context->grid);
		square_set_feat(cave, context->grid, FEAT_LAVA);

		/* Objects that have survived should move */
		push_object(context->grid);
	}
}